

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O3

bool __thiscall DelaunayMST::isInCircle(DelaunayMST *this,int a,int b,int c,int d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Point2d *pPVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pPVar5 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
           super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
           super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
  dVar1 = pPVar5[a].x;
  dVar2 = pPVar5[a].y;
  dVar14 = pPVar5[b].x;
  dVar15 = pPVar5[b].y;
  dVar13 = dVar14 * dVar14 + dVar15 * dVar15;
  dVar10 = pPVar5[c].x;
  dVar8 = pPVar5[c].y;
  dVar6 = dVar10 * dVar10 + dVar8 * dVar8;
  dVar3 = pPVar5[d].x;
  dVar4 = pPVar5[d].y;
  dVar14 = dVar14 - dVar1;
  dVar15 = dVar15 - dVar2;
  dVar10 = dVar10 - dVar1;
  dVar8 = dVar8 - dVar2;
  dVar12 = dVar14 * dVar8 - dVar10 * dVar15;
  dVar7 = dVar13;
  dVar9 = dVar15;
  dVar11 = dVar14;
  if (dVar12 < 0.0) {
    dVar12 = dVar10 * dVar15 - dVar14 * dVar8;
    dVar7 = dVar6;
    dVar9 = dVar8;
    dVar11 = dVar10;
    dVar6 = dVar13;
    dVar10 = dVar14;
    dVar8 = dVar15;
  }
  dVar14 = dVar1 * dVar1 + dVar2 * dVar2;
  return ((dVar3 * dVar3 + dVar4 * dVar4) - dVar14) * dVar12 +
         (dVar4 - dVar2) * ((dVar7 - dVar14) * dVar10 - (dVar6 - dVar14) * dVar11) +
         (dVar3 - dVar1) * (dVar9 * (dVar6 - dVar14) - dVar8 * (dVar7 - dVar14)) < 0.0;
}

Assistant:

bool isInCircle(int a, int b, int c, int d)
	{
		auto mapToHiDim = [](const Point2d &p2)
		{ return Point3d{p2.x, p2.y, p2.x * p2.x + p2.y * p2.y}; };
		Point3d pa = mapToHiDim(p[a]), pb = mapToHiDim(p[b]), pc = mapToHiDim(p[c]), pd = mapToHiDim(p[d]);
		if (cross(p[a], p[b], p[c]) < 0)
			std::swap(pb, pc);
		return Point3d::dot(cross(pa, pb, pc), (pd - pa)) < 0;
	}